

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O2

int pfx_table_append_elem(node_data *data,pfx_record *record)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  data_elem *pdVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pdVar4 = (data_elem *)lrtr_realloc(data->ary,(ulong)(data->len + 1) << 4);
  if (pdVar4 == (data_elem *)0x0) {
    iVar3 = -1;
  }
  else {
    uVar1 = data->len;
    data->len = uVar1 + 1;
    data->ary = pdVar4;
    pdVar4[uVar1].asn = record->asn;
    pdVar4[uVar1].max_len = record->max_len;
    pdVar4[uVar1].socket = record->socket;
    iVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

int pfx_table_append_elem(struct node_data *data, const struct pfx_record *record)
{
	struct data_elem *tmp = lrtr_realloc(data->ary, sizeof(struct data_elem) * ((data->len) + 1));

	if (!tmp)
		return PFX_ERROR;
	data->len++;
	data->ary = tmp;
	data->ary[data->len - 1].asn = record->asn;
	data->ary[data->len - 1].max_len = record->max_len;
	data->ary[data->len - 1].socket = record->socket;
	return PFX_SUCCESS;
}